

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

void duckdb::ArgMinMaxBase<duckdb::LessThan,false>::
     Combine<duckdb::ArgMinMaxState<double,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
               (ArgMinMaxState<double,_duckdb::string_t> *source,
               ArgMinMaxState<double,_duckdb::string_t> *target,AggregateInputData *param_3)

{
  bool bVar1;
  string_t *in_RDX;
  string_t *in_RSI;
  byte *in_RDI;
  
  if (((*in_RDI & 1) != 0) &&
     (((undefined1  [16])((undefined1  [16])in_RSI->value & (undefined1  [16])0x1) ==
       (undefined1  [16])0x0 ||
      (bVar1 = LessThan::Operation<duckdb::string_t>(in_RSI,in_RDX), bVar1)))) {
    Assign<double,duckdb::string_t,duckdb::ArgMinMaxState<double,duckdb::string_t>>
              (source,(double *)target,(string_t *)param_3,SUB81((ulong)in_RDI >> 0x38,0));
    *(undefined1 *)&in_RSI->value = 1;
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}